

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_hsch(CPUS390XState_conflict *env,uint64_t r1)

{
  uint64_t r1_local;
  CPUS390XState_conflict *env_local;
  
  return;
}

Assistant:

void HELPER(hsch)(CPUS390XState *env, uint64_t r1)
{
#if 0
    S390CPU *cpu = env_archcpu(env);
    qemu_mutex_lock_iothread();
    ioinst_handle_hsch(cpu, r1, GETPC());
    qemu_mutex_unlock_iothread();
#endif
}